

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  long lVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    Traits<float>::doPrintIVal(fmt,(Interval *)(&ival->m_data[0].m_hasNaN + lVar1),os);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}